

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

void __thiscall TasGrid::GridSequence::differentiate(GridSequence *this,double *x,double *jacobian)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  pointer piVar7;
  size_t sVar8;
  pointer pdVar9;
  pointer pdVar10;
  ulong uVar11;
  int j_3;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int j_1;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  undefined8 local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  value_cache;
  vector<double,_std::allocator<double>_> diff_values;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  derivative_cache;
  
  cacheBasisValues<double>(&value_cache,this,x);
  cacheBasisDerivatives<double>(&derivative_cache,this,x);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&diff_values,
             (long)(this->super_BaseCanonicalGrid).num_dimensions,(allocator_type *)&local_80);
  local_80 = 0;
  ::std::__fill_n_a<double*,int,double>
            (jacobian,(this->super_BaseCanonicalGrid).num_dimensions *
                      (this->super_BaseCanonicalGrid).num_outputs);
  uVar2 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  sVar6 = (this->super_BaseCanonicalGrid).points.num_dimensions;
  piVar7 = (this->super_BaseCanonicalGrid).points.indexes.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  sVar8 = (this->surpluses).stride;
  pdVar9 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
  lVar17 = (long)(int)uVar3;
  uVar15 = 0;
  uVar19 = 0;
  if (0 < (int)uVar3) {
    uVar19 = (ulong)uVar3;
  }
  uVar4 = (this->super_BaseCanonicalGrid).num_outputs;
  uVar20 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar20 = uVar15;
  }
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = uVar15;
  }
  for (; lVar21 = 1, uVar15 != uVar11; uVar15 = uVar15 + 1) {
    piVar1 = piVar7 + sVar6 * uVar15;
    iVar5 = *piVar1;
    *diff_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
     ._M_start = ((derivative_cache.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar5];
    for (lVar13 = lVar21; lVar13 < lVar17; lVar13 = lVar13 + 1) {
      diff_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar13] =
           ((value_cache.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start[iVar5];
    }
    lVar13 = 2;
    for (; lVar21 < lVar17; lVar21 = lVar21 + 1) {
      iVar5 = piVar1[lVar21];
      pdVar10 = value_cache.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar21].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      for (lVar18 = 0; lVar21 != lVar18; lVar18 = lVar18 + 1) {
        diff_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar18] =
             pdVar10[iVar5] *
             diff_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar18];
      }
      diff_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar21] =
           derivative_cache.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar21].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5] *
           diff_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar21];
      for (lVar18 = lVar13; (int)lVar18 < (int)uVar3; lVar18 = lVar18 + 1) {
        diff_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar18] =
             value_cache.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar21].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar5] *
             diff_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar18];
      }
      lVar13 = lVar13 + 1;
    }
    pdVar14 = jacobian;
    for (uVar16 = 0; uVar16 != uVar20; uVar16 = uVar16 + 1) {
      for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
        pdVar14[uVar12] =
             pdVar9[sVar8 * uVar15 + uVar16] *
             diff_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12] + pdVar14[uVar12];
      }
      pdVar14 = pdVar14 + lVar17;
    }
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&diff_values);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&derivative_cache);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&value_cache);
  return;
}

Assistant:

void GridSequence::differentiate(const double x[], double jacobian[]) const {
    // Based on the logic in the TasGrid::GridSequence::evaluate() and TasGrid::GridSequence::getDifferentiationWeights() functions.
    std::vector<std::vector<double>> value_cache = cacheBasisValues<double>(x);
    std::vector<std::vector<double>> derivative_cache = cacheBasisDerivatives<double>(x);
    std::vector<double> diff_values(num_dimensions);
    std::fill_n(jacobian, num_outputs * num_dimensions, 0.0);
    int n = points.getNumIndexes();
    for(int i=0; i<n; i++) {
        const int* p = points.getIndex(i);
        const double *s = surpluses.getStrip(i);

        diff_values[0] = derivative_cache[0][p[0]];
        for(int j=1; j<num_dimensions; j++) diff_values[j] = value_cache[0][p[0]];

        for(int k=1; k<num_dimensions; k++) {
            for(int j=0; j<k; j++) diff_values[j] *= value_cache[k][p[k]];
            diff_values[k] *= derivative_cache[k][p[k]];
            for(int j=k+1; j<num_dimensions; j++) diff_values[j] *= value_cache[k][p[k]];
        }
        for(int k=0; k<num_outputs; k++)
            for(int j=0; j<num_dimensions; j++)
                jacobian[k * num_dimensions + j] += s[k] * diff_values[j];
    }
}